

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutosvg.c
# Opt level: O2

_Bool skip_ws(char **begin,char *end)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)*begin;
  while (((pbVar1 < end && ((ulong)*pbVar1 < 0x21)) &&
         ((0x100002600U >> ((ulong)*pbVar1 & 0x3f) & 1) != 0))) {
    pbVar1 = pbVar1 + 1;
  }
  *begin = (char *)pbVar1;
  return pbVar1 < end;
}

Assistant:

static inline bool skip_ws(const char** begin, const char* end)
{
    const char* it = *begin;
    while(it < end && IS_WS(*it))
        ++it;
    *begin = it;
    return it < end;
}